

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O1

int32_t __thiscall icu_63::Edits::Iterator::readLength(Iterator *this,int32_t head)

{
  int iVar1;
  
  if (0x3c < head) {
    if (head == 0x3d) {
      iVar1 = this->index;
      this->index = iVar1 + 1;
      return this->array[iVar1] & 0x7fff;
    }
    iVar1 = this->index;
    head = this->array[(long)iVar1 + 1] & 0x7fff |
           (this->array[iVar1] & 0x7fff) << 0xf | (head & 1U) << 0x1e;
    this->index = iVar1 + 2;
  }
  return head;
}

Assistant:

int32_t Edits::Iterator::readLength(int32_t head) {
    if (head < LENGTH_IN_1TRAIL) {
        return head;
    } else if (head < LENGTH_IN_2TRAIL) {
        U_ASSERT(index < length);
        U_ASSERT(array[index] >= 0x8000);
        return array[index++] & 0x7fff;
    } else {
        U_ASSERT((index + 2) <= length);
        U_ASSERT(array[index] >= 0x8000);
        U_ASSERT(array[index + 1] >= 0x8000);
        int32_t len = ((head & 1) << 30) |
                ((int32_t)(array[index] & 0x7fff) << 15) |
                (array[index + 1] & 0x7fff);
        index += 2;
        return len;
    }
}